

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O3

bool __thiscall
cmProcessOutput::DecodeText
          (cmProcessOutput *this,char *data,size_t length,string *decoded,size_t id)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,data,data + length);
  std::__cxx11::string::swap((string *)decoded);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return true;
}

Assistant:

bool cmProcessOutput::DecodeText(const char* data, size_t length,
                                 std::string& decoded, size_t id)
{
  return DecodeText(std::string(data, length), decoded, id);
}